

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

cmGeneratedFileStream * __thiscall
cmGeneratedFileStream::Open(cmGeneratedFileStream *this,char *name,bool quiet,bool binaryFlag)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  char *m2;
  bool binaryFlag_local;
  bool quiet_local;
  char *name_local;
  cmGeneratedFileStream *this_local;
  
  cmGeneratedFileStreamBase::Open
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  if (binaryFlag) {
    _Var1 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_bin);
    std::ofstream::open((char *)this,_Var1);
  }
  else {
    _Var1 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)this,_Var1);
  }
  uVar2 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((uVar2 & 1) != 0) && (!quiet)) {
    m2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Cannot open file for write: ",m2,(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  return this;
}

Assistant:

cmGeneratedFileStream&
cmGeneratedFileStream::Open(const char* name, bool quiet, bool binaryFlag)
{
  // Store the file name and construct the temporary file name.
  this->cmGeneratedFileStreamBase::Open(name);

  // Open the temporary output file.
  if ( binaryFlag )
    {
    this->Stream::open(this->TempName.c_str(),
                       std::ios::out | std::ios::binary);
    }
  else
    {
    this->Stream::open(this->TempName.c_str(), std::ios::out);
    }

  // Check if the file opened.
  if(!*this && !quiet)
    {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
    }
  return *this;
}